

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.c
# Opt level: O1

void test_encode(void)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  uint8_t *in;
  test_case *ptVar6;
  char local_438 [8];
  char buf [1024];
  char name [8];
  
  in = "";
  ptVar6 = cases;
  uVar4 = 0;
  do {
    ptVar6 = ptVar6 + 1;
    snprintf(buf + 0x3f8,8,"%d",uVar4 & 0xffffffff);
    acutest_case_("%s",buf + 0x3f8);
    sVar2 = strlen((char *)in);
    sVar3 = nni_base64_encode(in,sVar2,local_438,0x400);
    uVar5 = (uint)sVar3;
    acutest_check_(~uVar5 >> 0x1f,
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x31,"%s","rv >= 0");
    __s = ptVar6[-1].encoded;
    in = (uint8_t *)ptVar6->decoded;
    sVar2 = strlen(__s);
    acutest_check_((uint)(uVar5 == (uint)sVar2),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x32,"%s","rv == (int) strlen(cases[i].encoded)");
    local_438[(int)uVar5] = '\0';
    iVar1 = strcmp(local_438,__s);
    acutest_check_((uint)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/websocket/base64_test.c"
                   ,0x34,"%s","strcmp(buf, cases[i].encoded) == 0");
    uVar4 = uVar4 + 1;
  } while (uVar4 != 7);
  return;
}

Assistant:

void
test_encode(void)
{
	int   i;
	void *dec;

	for (i = 0; (dec = cases[i].decoded) != NULL; i++) {
		char buf[1024];
		char name[8];
		int  rv;

		(void) snprintf(name, sizeof(name), "%d", i);
		TEST_CASE(name);
		rv = (int) nni_base64_encode(dec, strlen(dec), buf, 1024);
		TEST_CHECK(rv >= 0);
		TEST_CHECK(rv == (int) strlen(cases[i].encoded));
		buf[rv] = 0;
		TEST_CHECK(strcmp(buf, cases[i].encoded) == 0);
	}
}